

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# E.h
# Opt level: O2

void __thiscall E::Print(E *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"ERROR: ");
  poVar1 = std::operator<<(poVar1,(string *)(this + 8));
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Print() const 
        { std::cout << "ERROR: "<< _m_error << std::endl;}